

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Clara::Opt::Opt(Opt *this,bool *ref)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b26d0;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001aff68;
  *(bool **)&this_00[1]._M_use_count = ref;
  (this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__ParserRefImpl_001b24d0;
  (this->super_ParserRefImpl<Catch::Clara::Opt>).m_optionality = Optional;
  (this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  (this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  (this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint.m_start = "";
  (this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint.m_size = 0;
  (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "";
  (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  (this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Opt_001af3d0;
  (this->m_optNames).super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_optNames).super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_optNames).super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Opt::Opt(bool& ref) :
            ParserRefImpl(std::make_shared<Detail::BoundFlagRef>(ref)) {}